

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O3

int Abc_CascadeExperiment
              (char *pFileGeneric,DdManager *dd,DdNode **pOutputs,int nInputs,int nOutputs,
              int nLutSize,int fCheck,int fVerbose)

{
  uint nNames;
  uint uVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  DdNode *pDVar5;
  char *pcVar6;
  Abc_Frame_t *pAbc;
  long lVar7;
  long lVar8;
  DdManager *dd_00;
  ulong uVar9;
  char FileNameFin [100];
  char FileNameIni [100];
  timespec ts;
  char Buffer [100];
  char *pNames [1024];
  DdNode *pbVarsEnc [1024];
  
  strcpy(FileNameIni,pFileGeneric);
  sVar4 = strlen(FileNameIni);
  builtin_strncpy(FileNameIni + sVar4,"_ENC.blif",10);
  strcpy(FileNameFin,pFileGeneric);
  sVar4 = strlen(FileNameFin);
  builtin_strncpy(FileNameFin + sVar4,"_LUT.blif",10);
  uVar3 = 0x1f;
  if (nOutputs - 1U != 0) {
    for (; nOutputs - 1U >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  uVar3 = (uVar3 ^ 0xffffffe0) + 0x21;
  if ((uint)nOutputs < 2) {
    uVar3 = nOutputs;
  }
  if (uVar3 != 0) {
    uVar9 = 0;
    do {
      pDVar5 = Cudd_bddNewVarAtLevel(dd,(int)uVar9);
      pbVarsEnc[uVar9] = pDVar5;
      uVar9 = uVar9 + 1;
    } while (uVar3 != uVar9);
  }
  nNames = uVar3 + nInputs;
  if (nInputs < 1) {
    uVar1 = 0;
  }
  else {
    uVar9 = 0;
    do {
      sprintf(Buffer,"pi%03d",uVar9 & 0xffffffff);
      pcVar6 = Extra_UtilStrsav(Buffer);
      pNames[uVar9] = pcVar6;
      uVar9 = uVar9 + 1;
      uVar1 = nInputs;
    } while ((uint)nInputs != uVar9);
  }
  if ((int)uVar1 < (int)nNames) {
    uVar9 = (ulong)uVar1;
    do {
      sprintf(Buffer,"OutEnc_%02d",(ulong)(uint)((int)uVar9 - nInputs));
      pcVar6 = Extra_UtilStrsav(Buffer);
      pNames[uVar9] = pcVar6;
      uVar9 = uVar9 + 1;
    } while (nNames != uVar9);
  }
  clock_gettime(3,(timespec *)&ts);
  pDVar5 = GetSingleOutputFunction(dd,pOutputs,nOutputs,pbVarsEnc,uVar3,fVerbose);
  Cudd_Ref(pDVar5);
  iVar2 = clock_gettime(3,(timespec *)&ts);
  if (iVar2 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,1);
  Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,1);
  if (fVerbose != 0) {
    uVar3 = Cudd_DagSize(pDVar5);
    printf("MTBDD reordered = %6d nodes\n",(ulong)uVar3);
    iVar2 = clock_gettime(3,(timespec *)&ts);
    if (iVar2 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    printf("Variable reordering time = %.2f sec\n",(double)((float)(lVar8 + lVar7) / 1e+06));
  }
  dd_00 = (DdManager *)0x3;
  clock_gettime(3,(timespec *)&ts);
  if (fCheck == 0) {
    iVar2 = CreateDecomposedNetwork(dd,pDVar5,pNames,nNames,FileNameFin,nLutSize,0,fVerbose);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    WriteSingleOutputFunctionBlif(dd_00,pDVar5,pNames,nNames,FileNameIni);
    iVar2 = CreateDecomposedNetwork(dd,pDVar5,pNames,nNames,FileNameFin,nLutSize,fCheck,fVerbose);
    if (iVar2 == 0) {
      return 0;
    }
    sprintf((char *)&ts,"cec %s %s",FileNameIni,FileNameFin);
    pAbc = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAbc,(char *)&ts);
  }
  Cudd_RecursiveDeref(dd,pDVar5);
  if (0 < (int)nNames) {
    uVar9 = 0;
    do {
      if (pNames[uVar9] != (char *)0x0) {
        free(pNames[uVar9]);
        pNames[uVar9] = (char *)0x0;
      }
      uVar9 = uVar9 + 1;
    } while (nNames != uVar9);
  }
  return 1;
}

Assistant:

int Abc_CascadeExperiment( char * pFileGeneric, DdManager * dd, DdNode ** pOutputs, int nInputs, int nOutputs, int nLutSize, int fCheck, int fVerbose )
{
    int i;
    int nVars = nInputs;
    int nOuts = nOutputs;
    abctime clk1;

    int      nVarsEnc;              // the number of additional variables to encode outputs
    DdNode * pbVarsEnc[MAXOUTPUTS]; // the BDDs of the encoding vars

    int      nNames;               // the total number of all inputs
    char *   pNames[MAXINPUTS];     // the temporary storage for the input (and output encoding) names

    DdNode * aFunc;                 // the encoded 0-1 BDD containing all the outputs

    char FileNameIni[100];
    char FileNameFin[100];
    char Buffer[100];

    
//pTable = fopen( "stats.txt", "a+" );
//fprintf( pTable, "%s ", pFileGeneric );
//fprintf( pTable, "%d ", nVars );
//fprintf( pTable, "%d ", nOuts );


    // assign the file names
    strcpy( FileNameIni, pFileGeneric );
    strcat( FileNameIni, "_ENC.blif" );

    strcpy( FileNameFin, pFileGeneric );
    strcat( FileNameFin, "_LUT.blif" );


    // create the variables to encode the outputs
    nVarsEnc = Abc_Base2Log( nOuts );
    for ( i = 0; i < nVarsEnc; i++ )
        pbVarsEnc[i] = Cudd_bddNewVarAtLevel( dd, i );


    // store the input names
    nNames  = nVars + nVarsEnc;
    for ( i = 0; i < nVars; i++ )
    {
//      pNames[i] = Extra_UtilStrsav( pFunc->pInputNames[i] );
        sprintf( Buffer, "pi%03d", i );
        pNames[i] = Extra_UtilStrsav( Buffer );
    }
    // set the encoding variable name
    for ( ; i < nNames; i++ )
    {       
        sprintf( Buffer, "OutEnc_%02d", i-nVars );
        pNames[i] = Extra_UtilStrsav( Buffer );
    }


    // print the variable order
//  printf( "\n" );
//  printf( "Variable order is: " );
//  for ( i = 0; i < dd->size; i++ )
//      printf( " %d", dd->invperm[i] );
//  printf( "\n" );

    // derive the single-output function
    clk1 = Abc_Clock();
    aFunc = GetSingleOutputFunction( dd, pOutputs, nOuts, pbVarsEnc, nVarsEnc, fVerbose );  Cudd_Ref( aFunc );
//  aFunc = GetSingleOutputFunctionRemapped( dd, pOutputs, nOuts, pbVarsEnc, nVarsEnc );  Cudd_Ref( aFunc );
//  if ( fVerbose )
//  printf( "Single-output function computation time = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );
 
//fprintf( pTable, "%d ", Cudd_SharingSize( pOutputs, nOutputs ) );
//fprintf( pTable, "%d ", Extra_ProfileWidthSharingMax(dd, pOutputs, nOutputs) );

    // dispose of the multiple-output function
//  Extra_Dissolve( pFunc );
 
    // reorder the single output function
//    if ( fVerbose )
//  printf( "Reordering variables...\n");
    clk1 = Abc_Clock();
//  if ( fVerbose )
//  printf( "Node count before = %6d\n", Cudd_DagSize( aFunc ) );
//  Cudd_ReduceHeap(dd, CUDD_REORDER_SIFT,1);
    Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
    Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
//  Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
//  Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
//  Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
//  Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
    if ( fVerbose )
    printf( "MTBDD reordered = %6d nodes\n", Cudd_DagSize( aFunc ) );
    if ( fVerbose )
    printf( "Variable reordering time = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );
//  printf( "\n" );
//  printf( "Variable order is: " );
//  for ( i = 0; i < dd->size; i++ )
//      printf( " %d", dd->invperm[i] );
//  printf( "\n" );
//fprintf( pTable, "%d ", Cudd_DagSize( aFunc ) );
//fprintf( pTable, "%d ", Extra_ProfileWidthMax(dd, aFunc) );

    // write the single-output function into BLIF for verification
    clk1 = Abc_Clock();
    if ( fCheck )
    WriteSingleOutputFunctionBlif( dd, aFunc, pNames, nNames, FileNameIni );
//    if ( fVerbose )
//  printf( "Single-output function writing time = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );

/*
    ///////////////////////////////////////////////////////////////////
    // verification of single output function
    clk1 = Abc_Clock();
    {
        BFunc g_Func;
        DdNode * aRes;

        g_Func.dd = dd;
        g_Func.FileInput = Extra_UtilStrsav(FileNameIni);

        if ( Extra_ReadFile( &g_Func ) == 0 )
        {
            printf( "\nSomething did not work out while reading the input file for verification\n");
            Extra_Dissolve( &g_Func );
            return;
        } 

        aRes = Cudd_BddToAdd( dd, g_Func.pOutputs[0] );  Cudd_Ref( aRes );

        if ( aRes != aFunc )
            printf( "\nVerification FAILED!\n");
        else
            printf( "\nVerification okay!\n");
        
        Cudd_RecursiveDeref( dd, aRes );

        // delocate
        Extra_Dissolve( &g_Func );
    }
    printf( "Preliminary verification time = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );
    ///////////////////////////////////////////////////////////////////
*/

    if ( !CreateDecomposedNetwork( dd, aFunc, pNames, nNames, FileNameFin, nLutSize, fCheck, fVerbose ) )
        return 0;

/*
    ///////////////////////////////////////////////////////////////////
    // verification of the decomposed LUT network
    clk1 = Abc_Clock();
    {
        BFunc g_Func;
        DdNode * aRes;

        g_Func.dd = dd;
        g_Func.FileInput = Extra_UtilStrsav(FileNameFin);

        if ( Extra_ReadFile( &g_Func ) == 0 )
        {
            printf( "\nSomething did not work out while reading the input file for verification\n");
            Extra_Dissolve( &g_Func );
            return;
        } 

        aRes = Cudd_BddToAdd( dd, g_Func.pOutputs[0] );  Cudd_Ref( aRes );

        if ( aRes != aFunc )
            printf( "\nFinal verification FAILED!\n");
        else
            printf( "\nFinal verification okay!\n");
        
        Cudd_RecursiveDeref( dd, aRes );
 
        // delocate 
        Extra_Dissolve( &g_Func );
    }
    printf( "Final verification time = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );
    ///////////////////////////////////////////////////////////////////
*/
 
    // verify the results
    if ( fCheck )
    {
        char Command[300];
        sprintf( Command, "cec %s %s", FileNameIni, FileNameFin );
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command );
    }

    Cudd_RecursiveDeref( dd, aFunc );

    // release the names
    for ( i = 0; i < nNames; i++ )
        ABC_FREE( pNames[i] );


//fprintf( pTable, "\n" );
//fclose( pTable );

    return 1;
}